

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O0

void build_terminal_node_mappings_single_tree<IsoTree>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *mappings,size_t *n_terminal,
               vector<IsoTree,_std::allocator<IsoTree>_> *tree)

{
  bool bVar1;
  size_type sVar2;
  const_reference node_00;
  reference pvVar3;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_RDX;
  value_type *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t node;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa8;
  unsigned_long *in_stack_ffffffffffffffb0;
  value_type vVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  size_type in_stack_ffffffffffffffc8;
  ulong uVar5;
  ulong __n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  
  __first._M_current = (unsigned_long *)in_RDI;
  std::vector<IsoTree,_std::allocator<IsoTree>_>::size(in_RDX);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x63b2de);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffffa8);
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
            (__first,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  *in_RSI = 0;
  uVar5 = 0;
  while (__n = uVar5, sVar2 = std::vector<IsoTree,_std::allocator<IsoTree>_>::size(in_RDX),
        uVar5 < sVar2) {
    node_00 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDX,__n);
    bVar1 = is_terminal_node(node_00);
    if (bVar1) {
      vVar4 = *in_RSI;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,__n);
      *pvVar3 = vVar4;
      *in_RSI = *in_RSI + 1;
    }
    uVar5 = __n + 1;
  }
  return;
}

Assistant:

void build_terminal_node_mappings_single_tree(std::vector<size_t> &mappings, size_t &n_terminal, const std::vector<Tree> &tree)
{
    mappings.resize(tree.size());
    mappings.shrink_to_fit();
    std::fill(mappings.begin(), mappings.end(), (size_t)0);
    
    n_terminal = 0;
    for (size_t node = 0; node < tree.size(); node++)
    {
        if (is_terminal_node(tree[node]))
        {
            mappings[node] = n_terminal;
            n_terminal++;
        }
    }
}